

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O1

void mxx::impl::gatherv_big<int>
               (int *data,size_t size,int *out,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,int root,comm *comm
               )

{
  MPI_Comm poVar1;
  MPI_Datatype poVar2;
  comm *pcVar3;
  ulong uVar4;
  long lVar5;
  datatype dt_1;
  datatype dt;
  requests reqs;
  datatype local_b0;
  int *local_98;
  size_t local_90;
  int *local_88;
  datatype local_80;
  undefined1 local_68 [8];
  pointer local_60;
  pointer ppoStack_58;
  pointer local_50;
  size_t local_48;
  comm *local_40;
  ulong local_38;
  
  local_68 = (undefined1  [8])&PTR__requests_00152340;
  local_60 = (pointer)0x0;
  ppoStack_58 = (pointer)0x0;
  local_50 = (pointer)0x0;
  local_98 = data;
  local_88 = out;
  if (comm->m_rank == root) {
    local_90 = size;
    if (0 < comm->m_size) {
      local_48 = size * 4;
      uVar4 = 0;
      lVar5 = 0;
      local_40 = comm;
      local_38 = (ulong)(uint)root;
      do {
        pcVar3 = local_40;
        local_b0._vptr_datatype = (_func_int **)&PTR__datatype_00152310;
        local_b0.mpitype = (MPI_Datatype)&ompi_mpi_int;
        local_b0.builtin = true;
        datatype::contiguous
                  (&local_80,&local_b0,
                   (recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start[uVar4]);
        datatype::~datatype(&local_b0);
        poVar2 = local_80.mpitype;
        if (local_38 == uVar4) {
          if (local_90 != 0) {
            memmove(local_88 + lVar5,local_98,local_48);
          }
        }
        else {
          poVar1 = pcVar3->mpi_comm;
          local_b0._vptr_datatype = (_func_int **)0x0;
          std::vector<ompi_request_t*,std::allocator<ompi_request_t*>>::
          emplace_back<ompi_request_t*>
                    ((vector<ompi_request_t*,std::allocator<ompi_request_t*>> *)&local_60,
                     (ompi_request_t **)&local_b0);
          MPI_Irecv(local_88 + lVar5,1,poVar2,uVar4 & 0xffffffff,0x4d2,poVar1,ppoStack_58 + -1);
        }
        lVar5 = lVar5 + (recv_sizes->
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar4];
        datatype::~datatype(&local_80);
        uVar4 = uVar4 + 1;
      } while ((long)uVar4 < (long)local_40->m_size);
    }
  }
  else {
    local_b0._vptr_datatype = (_func_int **)&PTR__datatype_00152310;
    local_b0.mpitype = (MPI_Datatype)&ompi_mpi_int;
    local_b0.builtin = true;
    datatype::contiguous(&local_80,&local_b0,size);
    datatype::~datatype(&local_b0);
    poVar1 = comm->mpi_comm;
    local_b0._vptr_datatype = (_func_int **)0x0;
    std::vector<ompi_request_t*,std::allocator<ompi_request_t*>>::emplace_back<ompi_request_t*>
              ((vector<ompi_request_t*,std::allocator<ompi_request_t*>> *)&local_60,
               (ompi_request_t **)&local_b0);
    MPI_Isend(local_98,1,local_80.mpitype,(ulong)(uint)root,0x4d2,poVar1,ppoStack_58 + -1);
    datatype::~datatype(&local_80);
  }
  MPI_Waitall((ulong)((long)ppoStack_58 - (long)local_60) >> 3,local_60,0);
  requests::~requests((requests *)local_68);
  return;
}

Assistant:

void gatherv_big(const T* data, size_t size, T* out, const std::vector<size_t>& recv_sizes, int root, const mxx::comm& comm = mxx::comm()) {
    // implementation of scatter for messages sizes that exceed MAX_INT
    mxx::requests reqs;
    int tag = 1234; // TODO: handle tags somewhere (as attributes in the comm?)
    if (comm.rank() == root) {
        size_t offset = 0;
        for (int i = 0; i < comm.size(); ++i) {
            mxx::datatype dt = mxx::get_datatype<T>().contiguous(recv_sizes[i]);
            if (i == root) {
                // copy input into output
                std::copy(data, data+size, out+offset);
            } else {
                MPI_Irecv(const_cast<T*>(out)+offset, 1, dt.type(), i, tag, comm, &reqs.add());
            }
            offset += recv_sizes[i];
        }
    } else {
        // create custom datatype to encapsulate the whole message
        mxx::datatype dt = mxx::get_datatype<T>().contiguous(size);
        MPI_Isend(const_cast<T*>(data), 1, dt.type(), root, tag, comm, &reqs.add());
    }
    reqs.wait();
}